

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O0

int dns_get_rcode(char *rsp,size_t len)

{
  char *pcVar1;
  uint8_t rcode_msb;
  char *opt;
  dns_header_t *hdr;
  size_t len_local;
  char *rsp_local;
  
  pcVar1 = dns_get_edns_opt(rsp,len);
  if ((rsp == (char *)0x0) || (len < 0xc)) {
    rsp_local._4_4_ = 0xffffffff;
  }
  else if (pcVar1 == (char *)0x0) {
    rsp_local._4_4_ = (uint)(*(ushort *)(rsp + 2) >> 8 & 0xf);
  }
  else {
    rsp_local._4_4_ = (uint)(byte)pcVar1[5] << 4 | (uint)(*(ushort *)(rsp + 2) >> 8 & 0xf);
  }
  return rsp_local._4_4_;
}

Assistant:

int dns_get_rcode(const char * rsp, size_t len)
{
    struct dns_header_t * hdr = (struct dns_header_t *)rsp;
    const char * opt = dns_get_edns_opt(rsp, len);

    if (!rsp || len < sizeof(struct dns_header_t))
        return -1;

    if (opt) {
        // For response with ENDS OPT, extended bits of rcode need to be included.
        uint8_t rcode_msb = *(opt 
                                + 1                // NAME
                                + sizeof(uint16_t) // OPT
                                + sizeof(uint16_t) // CLASS
                              );
        return (rcode_msb << RCODE_BITS) | hdr->rcode;
    }
    else {
        return hdr->rcode;
    }
}